

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

Var Js::JavascriptArray::ProfiledNewInstanceNoArg
              (RecyclableObject *function,ScriptContext *scriptContext,ArrayCallSiteInfo *arrayInfo,
              RecyclerWeakReference<Js::FunctionBody> *weakFuncRef)

{
  bool bVar1;
  ThreadContext *pTVar2;
  JavascriptLibrary *this;
  code *pcVar3;
  bool bVar4;
  JavascriptFunction *pJVar5;
  undefined4 *puVar6;
  JavascriptNativeArray *this_00;
  
  pTVar2 = scriptContext->threadContext;
  bVar1 = pTVar2->noJsReentrancy;
  pTVar2->noJsReentrancy = true;
  bVar4 = VarIsImpl<Js::JavascriptFunction>(function);
  if (bVar4) {
    pJVar5 = VarTo<Js::JavascriptFunction,Js::RecyclableObject>(function);
    if ((pJVar5->functionInfo).ptr == (FunctionInfo *)EntryInfo::NewInstance) goto LAB_00a4191c;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar6 = 1;
  bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                              ,0x532,
                              "(VarIs<JavascriptFunction>(function) && VarTo<JavascriptFunction>(function)->GetFunctionInfo() == &JavascriptArray::EntryInfo::NewInstance)"
                              ,
                              "VarIs<JavascriptFunction>(function) && VarTo<JavascriptFunction>(function)->GetFunctionInfo() == &JavascriptArray::EntryInfo::NewInstance"
                             );
  if (!bVar4) {
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  *puVar6 = 0;
LAB_00a4191c:
  bVar4 = ArrayCallSiteInfo::IsNativeIntArray(arrayInfo);
  if (bVar4) {
    this_00 = &JavascriptLibrary::CreateNativeIntArray
                         ((scriptContext->super_ScriptContextBase).javascriptLibrary)->
               super_JavascriptNativeArray;
    JavascriptNativeArray::SetArrayProfileInfo(this_00,weakFuncRef,arrayInfo);
  }
  else {
    bVar4 = ArrayCallSiteInfo::IsNativeFloatArray(arrayInfo);
    this = (scriptContext->super_ScriptContextBase).javascriptLibrary;
    if (bVar4) {
      this_00 = &JavascriptLibrary::CreateNativeFloatArray(this)->super_JavascriptNativeArray;
      JavascriptNativeArray::SetArrayProfileInfo(this_00,weakFuncRef,arrayInfo);
    }
    else {
      this_00 = (JavascriptNativeArray *)JavascriptLibrary::CreateArray(this);
    }
  }
  pTVar2->noJsReentrancy = bVar1;
  return this_00;
}

Assistant:

Var JavascriptArray::ProfiledNewInstanceNoArg(RecyclableObject *function, ScriptContext *scriptContext, ArrayCallSiteInfo *arrayInfo, RecyclerWeakReference<FunctionBody> *weakFuncRef)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(ScrArr_ProfiledNewInstanceNoArg, reentrancylock, scriptContext->GetThreadContext());
        Assert(VarIs<JavascriptFunction>(function) &&
               VarTo<JavascriptFunction>(function)->GetFunctionInfo() == &JavascriptArray::EntryInfo::NewInstance);

        if (arrayInfo->IsNativeIntArray())
        {
            JavascriptNativeIntArray *arr = scriptContext->GetLibrary()->CreateNativeIntArray();
            arr->SetArrayProfileInfo(weakFuncRef, arrayInfo);
            return arr;
        }

        if (arrayInfo->IsNativeFloatArray())
        {
            JavascriptNativeFloatArray *arr = scriptContext->GetLibrary()->CreateNativeFloatArray();
            arr->SetArrayProfileInfo(weakFuncRef, arrayInfo);
            return arr;
        }

        return scriptContext->GetLibrary()->CreateArray();
        JIT_HELPER_END(ScrArr_ProfiledNewInstanceNoArg);
    }